

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

void __thiscall Jinx::Impl::Parser::ParseBlock(Parser *this)

{
  pointer pSVar1;
  byte bVar2;
  
  if (this->m_error != false) {
    return;
  }
  ScopeBegin(this);
  bVar2 = this->m_error;
  if ((bool)bVar2 == false) {
    do {
      pSVar1 = (this->m_currentSymbol)._M_current;
      if (pSVar1 == (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish) {
        if ((bVar2 & 1) != 0) break;
      }
      else if (pSVar1->type == End || (bVar2 & 1) != 0) break;
      pSVar1 = (this->m_currentSymbol)._M_current;
      if (pSVar1 == (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish) {
        if ((bVar2 & 1) != 0) break;
      }
      else if (pSVar1->type == Else || (bVar2 & 1) != 0) break;
      pSVar1 = (this->m_currentSymbol)._M_current;
      if (pSVar1 == (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish) {
        if ((bVar2 & 1) != 0) break;
      }
      else if (pSVar1->type == Until || (bVar2 & 1) != 0) break;
      pSVar1 = (this->m_currentSymbol)._M_current;
      if (pSVar1 != (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish) {
        bVar2 = bVar2 | pSVar1->type == While;
      }
      if ((bVar2 & 1) != 0) break;
      ParseStatement(this);
      bVar2 = this->m_error;
    } while ((bool)bVar2 != true);
  }
  ScopeEnd(this);
  return;
}

Assistant:

inline_t void Parser::ParseBlock()
	{
		if (m_error)
			return;

		// Push local variable stack frame
		ScopeBegin();

		// Parse each statement until we reach a terminating symbol
		while (!(Check(SymbolType::End) || Check(SymbolType::Else) || Check(SymbolType::Until) || Check(SymbolType::While)) && !m_error)
			ParseStatement();

		// Pop local variable stack frame
		ScopeEnd();
	}